

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall LinearScan::KillImplicitRegs(LinearScan *this,Instr *instr)

{
  BitVector *pBVar1;
  long lVar2;
  code *pcVar3;
  RegNum RVar4;
  bool bVar5;
  BVIndex BVar6;
  undefined4 *puVar7;
  Loop *pLVar8;
  ulong uVar9;
  ulong uVar10;
  
  if ((instr->m_kind < 6) && ((0x2cU >> (instr->m_kind & 0x1f) & 1) != 0)) {
    (this->tempRegs).word = 0;
  }
  if (instr->m_opcode != Yield) {
    if (instr->m_opcode == IMUL) {
      RVar4 = LowererMDArch::GetRegIMulHighDestLower();
      SpillReg(this,RVar4,false);
      RVar4 = LowererMDArch::GetRegIMulHighDestLower();
      BVUnitT<unsigned_long>::AssertRange((uint)RVar4);
      (this->tempRegs).word =
           (this->tempRegs).word &
           (-2L << (RVar4 & (RegXMM15|RegXMM14)) |
           0xfffffffffffffffeU >> 0x40 - (RVar4 & (RegXMM15|RegXMM14)));
      RVar4 = LowererMDArch::GetRegIMulHighDestLower();
      RecordLoopUse(this,(Lifetime *)0x0,RVar4);
      return;
    }
    TrackInlineeArgLifetimes(this,instr);
    bVar5 = LowererMD::IsCall(instr);
    if ((!bVar5) && ((instr->field_0x38 & 0x10) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xd1f,"(LowererMD::IsCall(instr) || !instr->HasBailOutInfo())",
                         "LowererMD::IsCall(instr) || !instr->HasBailOutInfo()");
      if (!bVar5) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    bVar5 = LowererMD::IsCall(instr);
    if ((bVar5) &&
       (((instr->field_0x38 & 0x10) == 0 || (bVar5 = IR::Instr::HasLazyBailOut(instr), bVar5)))) {
      if ((this->currentBlock->inlineeStack).
          super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count < 1) {
        instr->m_func = this->func;
      }
      else {
        SpillInlineeArgs(this,instr);
      }
      uVar10 = (this->callerSavedRegs).word & (this->activeRegs).word;
      if (uVar10 != 0) {
        uVar9 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        do {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar9);
          uVar10 = uVar10 & ~(1L << (uVar9 & 0x3f));
          SpillReg(this,(RegNum)uVar9,false);
          lVar2 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
            }
          }
          uVar9 = (ulong)(-(uint)(uVar10 == 0) | (uint)lVar2);
        } while (uVar10 != 0);
      }
      (this->tempRegs).word = (this->tempRegs).word & (this->calleeSavedRegs).word;
      BVar6 = BVUnitT<unsigned_long>::CountBit((this->callSetupRegs).word);
      if (BVar6 != 0) {
        (this->callSetupRegs).word = 0;
      }
      for (pLVar8 = this->curLoop; pLVar8 != (Loop *)0x0; pLVar8 = pLVar8->parent) {
        pBVar1 = &(pLVar8->regAlloc).regUseBv;
        pBVar1->word = pBVar1->word | (this->callerSavedRegs).word;
      }
    }
    return;
  }
  GeneratorBailIn::SpillRegsForBailIn(&this->bailIn);
  return;
}

Assistant:

void
LinearScan::KillImplicitRegs(IR::Instr *instr)
{
    if (instr->IsLabelInstr() || instr->IsBranchInstr())
    {
        // Note: need to clear these for branch as well because this info isn't recorded for second chance
        //       allocation on branch boundaries
        this->tempRegs.ClearAll();
    }

#if defined(_M_IX86) || defined(_M_X64)
    if (instr->m_opcode == Js::OpCode::IMUL)
    {
        this->SpillReg(LowererMDArch::GetRegIMulHighDestLower());
        this->tempRegs.Clear(LowererMDArch::GetRegIMulHighDestLower());

        this->RecordLoopUse(nullptr, LowererMDArch::GetRegIMulHighDestLower());
        return;
    }

    if (instr->m_opcode == Js::OpCode::Yield)
    {
        this->bailIn.SpillRegsForBailIn();
        return;
    }
#endif

    this->TrackInlineeArgLifetimes(instr);

    // Don't care about kills on bailout calls (e.g: call SaveAllRegAndBailOut) as we are going to exit anyways.
    // Note that those are different from normal helper calls with LazyBailOut because they are not guaranteed to exit.
    // Also, for bailout scenarios we have already handled the inlinee frame spills.
    // 
    // Lazy bailout:
    // Also make sure that Call instructions that previously do not have bailouts are still processed the same way in RegAlloc
    // Previously only `call SaveAllRegistersAndBailOut` can have bailout, but now other calls may have lazy bailouts too.
    // This makes them not being processed the same way as before(such as computing Lifetime across calls).
    Assert(LowererMD::IsCall(instr) || !instr->HasBailOutInfo());
    if (!LowererMD::IsCall(instr) || (instr->HasBailOutInfo() && !instr->HasLazyBailOut()))
    {
        return;
    }

    if (this->currentBlock->inlineeStack.Count() > 0)
    {
        this->SpillInlineeArgs(instr);
    }
    else
    {
        instr->m_func = this->func;
    }

    //
    // Spill caller-saved registers that are active.
    //
    BitVector deadRegs;
    deadRegs.Copy(this->activeRegs);
    deadRegs.And(this->callerSavedRegs);
    FOREACH_BITSET_IN_UNITBV(reg, deadRegs, BitVector)
    {
        this->SpillReg((RegNum)reg);
    }
    NEXT_BITSET_IN_UNITBV;
    this->tempRegs.And(this->calleeSavedRegs);

    if (callSetupRegs.Count())
    {
        callSetupRegs.ClearAll();
    }
    Loop *loop = this->curLoop;
    while (loop)
    {
        loop->regAlloc.regUseBv.Or(this->callerSavedRegs);
        loop = loop->parent;
    }
}